

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

Value * __thiscall
BasicBlock::FindValueInLocalThenGlobalValueTableAndUpdate
          (BasicBlock *this,GlobOpt *globOpt,GlobHashTable *localSymToValueMap,Instr *instr,
          Sym *dstSym,Sym *srcSym)

{
  code *pcVar1;
  bool bVar2;
  Value **ppVVar3;
  StackSym *srcSym_00;
  ValueInfo *srcValueInfo;
  undefined4 *puVar4;
  Value *globalValue;
  Value **localSrcValue;
  Value *srcVal;
  Value **localDstValue;
  Sym *srcSym_local;
  Sym *dstSym_local;
  Instr *instr_local;
  GlobHashTable *localSymToValueMap_local;
  GlobOpt *globOpt_local;
  BasicBlock *this_local;
  
  srcVal = (Value *)0x0;
  if (dstSym != (Sym *)0x0) {
    srcVal = (Value *)ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew(localSymToValueMap,dstSym);
  }
  ppVVar3 = ValueHashTable<Sym_*,_Value_*>::Get(localSymToValueMap,srcSym);
  if (ppVVar3 == (Value **)0x0) {
    localSrcValue = (Value **)GlobOptBlockData::FindValue(&this->globOptData,srcSym);
    bVar2 = GlobOpt::IsLoopPrePass(globOpt);
    if ((bVar2) && ((Value *)localSrcValue != (Value *)0x0)) {
      bVar2 = Sym::IsStackSym(srcSym);
      if (bVar2) {
        srcSym_00 = Sym::AsStackSym(srcSym);
        srcValueInfo = ::Value::GetValueInfo((Value *)localSrcValue);
        bVar2 = GlobOpt::IsSafeToTransferInPrepass(globOpt,srcSym_00,srcValueInfo);
        if (bVar2) goto LAB_0053b64a;
      }
      localSrcValue = (Value **)0x0;
    }
  }
  else {
    localSrcValue = (Value **)*ppVVar3;
  }
LAB_0053b64a:
  if (dstSym != (Sym *)0x0) {
    bVar2 = IsCopyTypeInstr(instr);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x1197,"(IsCopyTypeInstr(instr))","IsCopyTypeInstr(instr)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    *(Value ***)srcVal = localSrcValue;
  }
  return (Value *)localSrcValue;
}

Assistant:

Value * BasicBlock::FindValueInLocalThenGlobalValueTableAndUpdate(GlobOpt *globOpt, GlobHashTable * localSymToValueMap, IR::Instr *instr, Sym *dstSym, Sym *srcSym)
{
    Value ** localDstValue = nullptr;
    Value * srcVal = nullptr;
    if (dstSym)
    {
        localDstValue = localSymToValueMap->FindOrInsertNew(dstSym);
    }
    Value ** localSrcValue = localSymToValueMap->Get(srcSym);
    if (!localSrcValue)
    {
        Value *globalValue = this->globOptData.FindValue(srcSym);
        if (globOpt->IsLoopPrePass() && globalValue && (!srcSym->IsStackSym() || !globOpt->IsSafeToTransferInPrepass(srcSym->AsStackSym(), globalValue->GetValueInfo())))
        {
            srcVal = nullptr;
        }
        else
        {
            srcVal = globalValue;
        }
    }
    else
    {
        srcVal = *localSrcValue;
    }
    if (dstSym)
    {
        Assert(IsCopyTypeInstr(instr));
        *localDstValue = srcVal;
    }

    return srcVal;
}